

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sameSrcAlias(SrcItem *p0,SrcList *pSrc)

{
  SrcItem *pSVar1;
  byte bVar2;
  int iVar3;
  Select *pSVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  iVar3 = pSrc->nSrc;
  if (0 < (long)iVar3) {
    lVar9 = 0;
    do {
      pSVar1 = pSrc->a + lVar9;
      if (pSVar1 == p0) {
        bVar6 = false;
      }
      else {
        if (p0->pSTab == pSVar1->pSTab) {
          pcVar5 = pSVar1->zAlias;
          if (p0->zAlias == (char *)0x0) {
            if (pcVar5 == (char *)0x0) {
LAB_0018995b:
              bVar6 = true;
              goto LAB_0018990f;
            }
          }
          else if (pcVar5 != (char *)0x0) {
            lVar8 = 0;
            do {
              bVar2 = p0->zAlias[lVar8];
              if (bVar2 == pcVar5[lVar8]) {
                if ((ulong)bVar2 == 0) goto LAB_0018995b;
              }
              else if (""[bVar2] != ""[(byte)pcVar5[lVar8]]) break;
              lVar8 = lVar8 + 1;
            } while( true );
          }
        }
        if ((((pSVar1->fg).field_0x1 & 4) != 0) &&
           (pSVar4 = ((pSVar1->u4).pSubq)->pSelect, (pSVar4->selFlags & 0x800) != 0)) {
          iVar7 = sameSrcAlias(p0,pSVar4->pSrc);
          bVar6 = true;
          if (iVar7 != 0) goto LAB_0018990f;
        }
        bVar6 = false;
      }
LAB_0018990f:
      if (bVar6) {
        return 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar3);
  }
  return 0;
}

Assistant:

static int sameSrcAlias(SrcItem *p0, SrcList *pSrc){
  int i;
  for(i=0; i<pSrc->nSrc; i++){
    SrcItem *p1 = &pSrc->a[i];
    if( p1==p0 ) continue;
    if( p0->pSTab==p1->pSTab && 0==sqlite3_stricmp(p0->zAlias, p1->zAlias) ){
      return 1;
    }
    if( p1->fg.isSubquery
     && (p1->u4.pSubq->pSelect->selFlags & SF_NestedFrom)!=0
     && sameSrcAlias(p0, p1->u4.pSubq->pSelect->pSrc)
    ){
      return 1;
    }
  }
  return 0;
}